

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Builder::adoptWithCaveats
          (Builder *this,uint index,Orphan<capnp::compiler::Token> *orphan)

{
  StructBuilder other;
  StructBuilder local_68;
  StructBuilder local_40;
  
  capnp::_::ListBuilder::getStructElement(&local_40,&this->builder,index);
  capnp::_::OrphanBuilder::asStruct(&local_68,&orphan->builder,(StructSize)0x0);
  other.capTable = local_68.capTable;
  other.segment = local_68.segment;
  other.data = local_68.data;
  other.pointers = local_68.pointers;
  other.dataSize = local_68.dataSize;
  other.pointerCount = local_68.pointerCount;
  other._38_2_ = local_68._38_2_;
  capnp::_::StructBuilder::transferContentFrom(&local_40,other);
  return;
}

Assistant:

inline void adoptWithCaveats(uint index, Orphan<T>&& orphan) {
      // Mostly behaves like you'd expect `adopt` to behave, but with two caveats originating from
      // the fact that structs in a struct list are allocated inline rather than by pointer:
      // * This actually performs a shallow copy, effectively adopting each of the orphan's
      //   children rather than adopting the orphan itself.  The orphan ends up being discarded,
      //   possibly wasting space in the message object.
      // * If the orphan is larger than the target struct -- say, because the orphan was built
      //   using a newer version of the schema that has additional fields -- it will be truncated,
      //   losing data.

      KJ_IREQUIRE(index < size());

      // We pass a zero-valued StructSize to asStruct() because we do not want the struct to be
      // expanded under any circumstances.  We're just going to throw it away anyway, and
      // transferContentFrom() already carefully compares the struct sizes before transferring.
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(_::StructSize(ZERO * WORDS, ZERO * POINTERS)));
    }